

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t UA_readNumber(UA_Byte *buf,size_t buflen,UA_UInt32 *number)

{
  byte bVar1;
  UA_Byte *pUStack_38;
  UA_Byte c;
  size_t progress;
  UA_UInt32 n;
  UA_UInt32 *number_local;
  size_t buflen_local;
  UA_Byte *buf_local;
  
  if (buf == (UA_Byte *)0x0) {
    buf_local = (UA_Byte *)0x0;
  }
  else {
    progress._4_4_ = 0;
    for (pUStack_38 = (UA_Byte *)0x0;
        ((pUStack_38 < buflen && (bVar1 = buf[(long)pUStack_38], 0x2f < bVar1)) && (bVar1 < 0x3a));
        pUStack_38 = pUStack_38 + 1) {
      progress._4_4_ = progress._4_4_ * 10 + (bVar1 - 0x30);
    }
    *number = progress._4_4_;
    buf_local = pUStack_38;
  }
  return (size_t)buf_local;
}

Assistant:

size_t UA_readNumber(UA_Byte *buf, size_t buflen, UA_UInt32 *number) {
    if (!buf)
        return 0;
    UA_UInt32 n = 0;
    size_t progress = 0;
    /* read numbers until the end or a non-number character appears */
    while(progress < buflen) {
        UA_Byte c = buf[progress];
        if('0' > c || '9' < c)
            break;
        n = (n*10) + (UA_UInt32)(c-'0');
        ++progress;
    }
    *number = n;
    return progress;
}